

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inputs.cpp
# Opt level: O0

defV * helics::vectorDiff(vector<std::variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>,_std::allocator<std::variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>_>_>
                          *vals)

{
  bool bVar1;
  reference pdVar2;
  undefined8 in_RSI;
  defV *in_RDI;
  double *el;
  const_iterator __end2;
  const_iterator __begin2;
  vector<double,_std::allocator<double>_> *__range2;
  vector<double,_std::allocator<double>_> *vect;
  variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
  *v;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>,_std::allocator<std::variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>_>_>
  *__range1;
  double start;
  vector<double,_std::allocator<double>_> X;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff58;
  defV *this;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff70;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_> local_78;
  vector<double,_std::allocator<double>_> *local_70;
  vector<double,_std::allocator<double>_> *local_58;
  reference local_50;
  variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
  *local_48;
  __normal_iterator<const_std::variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>_*,_std::vector<std::variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>,_std::allocator<std::variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>_>_>_>
  local_40;
  undefined8 local_38;
  double local_30;
  undefined8 local_10;
  
  this = in_RDI;
  local_10 = in_RSI;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x369321);
  local_30 = -1e+49;
  local_38 = local_10;
  local_40._M_current =
       (variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
        *)std::
          vector<std::variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>,_std::allocator<std::variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>_>_>
          ::begin((vector<std::variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>,_std::allocator<std::variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>_>_>
                   *)in_stack_ffffffffffffff58);
  local_48 = (variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
              *)std::
                vector<std::variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>,_std::allocator<std::variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>_>_>
                ::end((vector<std::variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>,_std::allocator<std::variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>_>_>
                       *)in_stack_ffffffffffffff58);
  while (bVar1 = __gnu_cxx::
                 operator==<const_std::variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>_*,_std::vector<std::variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>,_std::allocator<std::variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>_>_>_>
                           ((__normal_iterator<const_std::variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>_*,_std::vector<std::variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>,_std::allocator<std::variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>_>_>_>
                             *)this,(__normal_iterator<const_std::variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>_*,_std::vector<std::variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>,_std::allocator<std::variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>_>_>_>
                                     *)in_stack_ffffffffffffff58), ((bVar1 ^ 0xffU) & 1) != 0) {
    local_50 = __gnu_cxx::
               __normal_iterator<const_std::variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>_*,_std::vector<std::variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>,_std::allocator<std::variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>_>_>_>
               ::operator*(&local_40);
    in_stack_ffffffffffffff58 =
         std::
         get<std::vector<double,std::allocator<double>>,double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                   ((variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
                     *)0x36938d);
    local_70 = in_stack_ffffffffffffff58;
    local_58 = in_stack_ffffffffffffff58;
    local_78._M_current =
         (double *)
         CLI::std::vector<double,_std::allocator<double>_>::begin
                   ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff58);
    CLI::std::vector<double,_std::allocator<double>_>::end
              ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff58);
    while (bVar1 = __gnu_cxx::
                   operator==<const_double_*,_std::vector<double,_std::allocator<double>_>_>
                             ((__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>
                               *)this,(__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>
                                       *)in_stack_ffffffffffffff58), ((bVar1 ^ 0xffU) & 1) != 0) {
      pdVar2 = __gnu_cxx::
               __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>::
               operator*(&local_78);
      if ((local_30 != -1e+49) || (NAN(local_30))) {
        in_stack_ffffffffffffff70 = (vector<double,_std::allocator<double>_> *)(local_30 - *pdVar2);
        std::vector<double,_std::allocator<double>_>::push_back
                  ((vector<double,_std::allocator<double>_> *)this,
                   (value_type_conflict3 *)in_stack_ffffffffffffff58);
      }
      local_30 = *pdVar2;
      __gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>::
      operator++(&local_78);
    }
    __gnu_cxx::
    __normal_iterator<const_std::variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>_*,_std::vector<std::variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>,_std::allocator<std::variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>_>_>_>
    ::operator++(&local_40);
  }
  std::
  variant<double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
  ::
  variant<std::vector<double,std::allocator<double>>,void,void,std::vector<double,std::allocator<double>>,void>
            (this,in_stack_ffffffffffffff58);
  CLI::std::vector<double,_std::allocator<double>_>::~vector(in_stack_ffffffffffffff70);
  return in_RDI;
}

Assistant:

static defV vectorDiff(const std::vector<defV>& vals)
{
    std::vector<double> X;
    double start{invalidDouble};
    for (const auto& v : vals) {
        const auto& vect = std::get<std::vector<double>>(v);
        for (const auto& el : vect) {
            if (start != invalidDouble) {
                X.push_back(start - el);
            }
            start = el;
        }
    }
    return X;
}